

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements
          (cmNinjaUtilityTargetGenerator *this,string *config,string *fileConfig)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  cmLocalNinjaGenerator *this_01;
  pointer pcVar5;
  pointer pcVar6;
  undefined8 *puVar7;
  cmCustomCommand *pcVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  size_t __n;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  computeInternalDepfile_00;
  bool bVar11;
  bool bVar12;
  TargetType TVar13;
  int iVar14;
  cmGlobalNinjaGenerator *this_02;
  string *psVar15;
  cmGlobalNinjaGenerator *this_03;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar16;
  long lVar17;
  cmCustomCommand *pcVar18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar19;
  MapToNinjaPathImpl MVar20;
  cmValue cVar21;
  const_iterator cVar22;
  long *plVar23;
  cmGeneratedFileStream *pcVar24;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar25;
  size_type *psVar26;
  pointer *ppcVar27;
  bool uses_terminal;
  pointer __x;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  string_view source_00;
  undefined8 uVar28;
  cmGeneratorTarget *this_04;
  cmGeneratorTarget *this_05;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> cmdLists;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_588;
  string ccConfig;
  string local_558;
  string desc;
  cmNinjaDeps deps;
  string configDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4c0;
  bool local_4a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_498;
  bool local_478;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string utilCommandName;
  CCOutputs util_outputs;
  char *local_398;
  size_type local_390;
  char local_388 [8];
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  code *local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  code *local_348;
  undefined8 uStack_340;
  string local_338;
  cmNinjaDeps local_318;
  cmNinjaDeps local_300;
  cmNinjaBuild phonyBuild;
  string outputConfig;
  CCOutputs local_68;
  
  this_02 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  this_04 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  this_01 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
  configDir._M_dataplus._M_p = (pointer)&configDir.field_2;
  configDir._M_string_length = 0;
  configDir.field_2._M_local_buf[0] = '\0';
  bVar11 = cmTarget::IsPerConfig(this_04->Target);
  if (bVar11) {
    (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49]
    )(&outputConfig,this_02,fileConfig);
    std::__cxx11::string::operator=((string *)&configDir,(string *)&outputConfig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)outputConfig._M_dataplus._M_p != &outputConfig.field_2) {
      operator_delete(outputConfig._M_dataplus._M_p,outputConfig.field_2._M_allocated_capacity + 1);
    }
  }
  psVar15 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
  pcVar5 = (psVar15->_M_dataplus)._M_p;
  pcVar6 = (pointer)psVar15->_M_string_length;
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            (&phonyBuild.Comment,&this->super_cmNinjaTargetGenerator);
  outputConfig.field_2._M_allocated_capacity = 0xb;
  outputConfig.field_2._8_8_ = anon_var_dwarf_86f782;
  views._M_len = 6;
  views._M_array = (iterator)&outputConfig;
  outputConfig._M_dataplus._M_p = pcVar6;
  outputConfig._M_string_length = (size_type)pcVar5;
  cmCatViews_abi_cxx11_(&utilCommandName,views);
  paVar2 = &phonyBuild.Comment.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)phonyBuild.Comment._M_dataplus._M_p != paVar2) {
    operator_delete(phonyBuild.Comment._M_dataplus._M_p,
                    CONCAT71(phonyBuild.Comment.field_2._M_allocated_capacity._1_7_,
                             phonyBuild.Comment.field_2._M_local_buf[0]) + 1);
  }
  this_03 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::ConvertToNinjaPath(this_03,&utilCommandName);
  std::__cxx11::string::_M_assign((string *)&utilCommandName);
  local_398 = local_388;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,"phony","");
  phonyBuild.Rule._M_dataplus._M_p = (pointer)&phonyBuild.Rule.field_2;
  phonyBuild.Comment._M_string_length = 0;
  phonyBuild.Comment.field_2._M_local_buf[0] = '\0';
  if (local_398 == local_388) {
    phonyBuild.Rule.field_2._8_8_ = uStack_380;
  }
  else {
    phonyBuild.Rule._M_dataplus._M_p = local_398;
  }
  phonyBuild.Rule._M_string_length = local_390;
  local_390 = 0;
  local_388[0] = '\0';
  p_Var3 = &phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_398 = local_388;
  phonyBuild.Comment._M_dataplus._M_p = (pointer)paVar2;
  memset(&phonyBuild.Outputs,0,0x90);
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  phonyBuild.RspFile._M_dataplus._M_p = (pointer)&phonyBuild.RspFile.field_2;
  phonyBuild.RspFile._M_string_length = 0;
  phonyBuild.RspFile.field_2._M_local_buf[0] = '\0';
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  deps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  util_outputs.ExplicitOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  util_outputs.WorkDirOuts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  util_outputs.GG = this_02;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  phonyBuild.Variables._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &util_outputs.ExplicitOuts,&utilCommandName);
  cmdLists._M_elems[0] = cmGeneratorTarget::GetPreBuildCommands(this_04);
  cmdLists._M_elems[1] = cmGeneratorTarget::GetPostBuildCommands(this_04);
  bVar11 = false;
  uses_terminal = false;
  lVar17 = 0;
  do {
    puVar7 = *(undefined8 **)((long)cmdLists._M_elems + lVar17);
    pcVar8 = (cmCustomCommand *)puVar7[1];
    for (pcVar18 = (cmCustomCommand *)*puVar7; pcVar18 != pcVar8; pcVar18 = pcVar18 + 1) {
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      pcVar5 = (fileConfig->_M_dataplus)._M_p;
      uVar28 = 0x419c74;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_410,pcVar5,pcVar5 + fileConfig->_M_string_length);
      local_478 = false;
      local_358 = 0;
      uStack_350 = 0;
      local_348 = (code *)0x0;
      uStack_340 = 0;
      computeInternalDepfile.super__Function_base._M_functor._8_8_ = uVar28;
      computeInternalDepfile.super__Function_base._M_functor._M_unused._M_object = &local_358;
      computeInternalDepfile.super__Function_base._M_manager = (_Manager_type)this_04;
      computeInternalDepfile._M_invoker = (_Invoker_type)this;
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)&outputConfig,pcVar18,&local_410,
                 (cmLocalGenerator *)this_01,true,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_498,computeInternalDepfile);
      if (local_348 != (code *)0x0) {
        (*local_348)(&local_358,&local_358,3);
      }
      if ((local_478 == true) &&
         (local_478 = false,
         local_498._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_498._M_value + 0x10))) {
        operator_delete((void *)local_498._M_value._M_dataplus._M_p,local_498._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_410._M_dataplus._M_p != &local_410.field_2) {
        operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
      }
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                (this_01,(cmCustomCommandGenerator *)&outputConfig,&deps,fileConfig);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (this_01,(cmCustomCommandGenerator *)&outputConfig,&commands);
      pvVar16 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)&outputConfig);
      cmGlobalNinjaGenerator::CCOutputs::Add(&util_outputs,pvVar16);
      bVar12 = cmCustomCommand::GetUsesTerminal(pcVar18);
      uses_terminal = bVar11;
      if (bVar12) {
        uses_terminal = true;
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)&outputConfig)
      ;
      bVar11 = uses_terminal;
    }
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x10);
  cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0;
  local_588._M_allocated_capacity = 0;
  cmGeneratorTarget::GetSourceFiles
            (this_04,(vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&cmdLists,config);
  pvVar25 = cmdLists._M_elems[1];
  if (cmdLists._M_elems[0] != cmdLists._M_elems[1]) {
    ppcVar27 = (pointer *)cmdLists._M_elems[0];
    do {
      pcVar18 = cmSourceFile::GetCustomCommand((cmSourceFile *)*ppcVar27);
      if (pcVar18 != (cmCustomCommand *)0x0) {
        local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
        pcVar5 = (config->_M_dataplus)._M_p;
        uVar28 = 0x419e3c;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_430,pcVar5,pcVar5 + config->_M_string_length);
        local_4a0 = false;
        local_378 = 0;
        uStack_370 = 0;
        local_368 = (code *)0x0;
        uStack_360 = 0;
        computeInternalDepfile_00.super__Function_base._M_functor._8_8_ = uVar28;
        computeInternalDepfile_00.super__Function_base._M_functor._M_unused._M_object = &local_378;
        computeInternalDepfile_00.super__Function_base._M_manager = (_Manager_type)this_04;
        computeInternalDepfile_00._M_invoker = (_Invoker_type)this;
        cmCustomCommandGenerator::cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&outputConfig,pcVar18,&local_430,
                   (cmLocalGenerator *)this_01,true,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_4c0,computeInternalDepfile_00);
        if (local_368 != (code *)0x0) {
          (*local_368)(&local_378,&local_378,3);
        }
        if ((local_4a0 == true) &&
           (local_4a0 = false,
           local_4c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4c0._M_value + 0x10)))
        {
          operator_delete((void *)local_4c0._M_value._M_dataplus._M_p,local_4c0._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_430._M_dataplus._M_p != &local_430.field_2) {
          operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
        }
        cmLocalNinjaGenerator::AddCustomCommandTarget(this_01,pcVar18,this_04);
        pvVar16 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                            ((cmCustomCommandGenerator *)&outputConfig);
        pvVar19 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                            ((cmCustomCommandGenerator *)&outputConfig);
        _Var9._M_current =
             (pvVar16->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var10._M_current =
             (pvVar16->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar20.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var9,_Var10,&deps,MVar20);
        _Var9._M_current =
             (pvVar19->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
        _Var10._M_current =
             (pvVar19->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        MVar20.GG = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
        std::
        transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                  (_Var9,_Var10,&deps,MVar20);
        cmCustomCommandGenerator::~cmCustomCommandGenerator
                  ((cmCustomCommandGenerator *)&outputConfig);
      }
      ppcVar27 = ppcVar27 + 1;
    } while ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)ppcVar27 != pvVar25);
  }
  if (cmdLists._M_elems[0] != (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)0x0) {
    operator_delete(cmdLists._M_elems[0],
                    local_588._M_allocated_capacity - (long)cmdLists._M_elems[0]);
  }
  outputConfig._M_dataplus._M_p = (pointer)&outputConfig.field_2;
  outputConfig._M_string_length = 0;
  outputConfig.field_2._M_allocated_capacity =
       outputConfig.field_2._M_allocated_capacity & 0xffffffffffffff00;
  bVar11 = cmTarget::IsPerConfig(this_04->Target);
  if (bVar11) {
    std::__cxx11::string::_M_assign((string *)&outputConfig);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs(this_01,this_04,&phonyBuild.Outputs,&outputConfig);
  TVar13 = cmTarget::GetType(this_04->Target);
  if (TVar13 != GLOBAL_TARGET) {
    cmLocalNinjaGenerator::AppendTargetOutputs
              (this_01,this_04,&this_02->ByproductsForCleanTarget,config);
    lVar17 = (long)util_outputs.ExplicitOuts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)util_outputs.ExplicitOuts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5;
    if (0 < lVar17) {
      lVar17 = lVar17 + 1;
      __x = util_outputs.ExplicitOuts.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this_02->ByproductsForCleanTarget,__x);
        __x = __x + 1;
        lVar17 = lVar17 + -1;
      } while (1 < lVar17);
    }
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            (this_01,this_04,&deps,config,fileConfig,DependOnTargetArtifact);
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&desc,&this->super_cmNinjaTargetGenerator);
    plVar23 = (long *)std::__cxx11::string::replace((ulong)&desc,0,(char *)0x0,0x7935f4);
    pvVar25 = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)(plVar23 + 2);
    if ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)*plVar23 == pvVar25) {
      local_588._M_allocated_capacity =
           (size_type)
           (pvVar25->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_start;
      local_588._8_8_ = plVar23[3];
      cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)&local_588
      ;
    }
    else {
      local_588._M_allocated_capacity =
           (size_type)
           (pvVar25->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl.
           super__Vector_impl_data._M_start;
      cmdLists._M_elems[0] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)*plVar23;
    }
    cmdLists._M_elems[1] = (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)plVar23[1];
    *plVar23 = (long)pvVar25;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    this_05 = this_04;
    std::__cxx11::string::operator=((string *)&phonyBuild,(string *)&cmdLists);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] != &local_588) {
      operator_delete(cmdLists._M_elems[0],(ulong)(local_588._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != &desc.field_2) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
    }
    local_588._M_allocated_capacity =
         (size_type)
         phonyBuild.ExplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    cmdLists._M_elems[1] =
         (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
         phonyBuild.ExplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmdLists._M_elems[0] =
         (vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)
         phonyBuild.ExplicitDeps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    phonyBuild.ExplicitDeps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         deps.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    deps.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cmdLists);
    TVar13 = cmGeneratorTarget::GetType(this_04);
    if (TVar13 == GLOBAL_TARGET) {
      pcVar24 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
    }
    else {
      pcVar24 = cmNinjaTargetGenerator::GetImplFileStream
                          (&this->super_cmNinjaTargetGenerator,fileConfig);
    }
    cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar24,&phonyBuild,0,(bool *)0x0);
LAB_0041a954:
    cmNinjaTargetGenerator::AdditionalCleanFiles(&this->super_cmNinjaTargetGenerator,config);
    TVar13 = cmGeneratorTarget::GetType(this_05);
    if (TVar13 == GLOBAL_TARGET) goto LAB_0041a9b3;
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)&cmdLists,&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddTargetAlias(this_02,(string *)&cmdLists,this_05,config);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] == &local_588) goto LAB_0041a9b3;
  }
  else {
    paVar2 = &desc.field_2;
    desc._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&desc,"utility","");
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&cmdLists,this_01,&commands,config,fileConfig,&desc,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    this_05 = this_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != paVar2) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
      this_05 = this_04;
    }
    desc._M_string_length = 0;
    desc.field_2._M_local_buf[0] = '\0';
    paVar1 = &ccConfig.field_2;
    ccConfig._M_dataplus._M_p = (pointer)paVar1;
    desc._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccConfig,"EchoString","");
    cVar21 = cmGeneratorTarget::GetProperty(this_05,&ccConfig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ccConfig._M_dataplus._M_p != paVar1) {
      operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
    }
    if (cVar21.Value == (string *)0x0) {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_558,&this->super_cmNinjaTargetGenerator);
      plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_558,0,(char *)0x0,0x793611);
      psVar26 = (size_type *)(plVar23 + 2);
      if ((size_type *)*plVar23 == psVar26) {
        ccConfig.field_2._M_allocated_capacity = *psVar26;
        ccConfig.field_2._8_8_ = plVar23[3];
        ccConfig._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        ccConfig.field_2._M_allocated_capacity = *psVar26;
        ccConfig._M_dataplus._M_p = (pointer)*plVar23;
      }
      ccConfig._M_string_length = plVar23[1];
      *plVar23 = (long)psVar26;
      plVar23[1] = 0;
      *(undefined1 *)(plVar23 + 2) = 0;
      std::__cxx11::string::operator=((string *)&desc,(string *)&ccConfig);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ccConfig._M_dataplus._M_p != paVar1) {
        operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&desc);
    }
    ccConfig._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccConfig,"$(CMAKE_SOURCE_DIR)","");
    psVar15 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
    this_00 = &(this_01->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    source._M_str = (psVar15->_M_dataplus)._M_p;
    source._M_len = psVar15->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_558,this_00,source,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,&ccConfig,&local_558);
    paVar4 = &local_558.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar4) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ccConfig._M_dataplus._M_p != paVar1) {
      operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
    }
    ccConfig._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ccConfig,"$(CMAKE_BINARY_DIR)","");
    psVar15 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_01);
    source_00._M_str = (psVar15->_M_dataplus)._M_p;
    source_00._M_len = psVar15->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_(&local_558,this_00,source_00,SHELL);
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,&ccConfig,&local_558);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != paVar4) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ccConfig._M_dataplus._M_p != paVar1) {
      operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ReplaceString((string *)&cmdLists,"$(ARGS)","");
    (*(this_02->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x16]
    )(&ccConfig,this_02,&cmdLists,config);
    std::__cxx11::string::operator=((string *)&cmdLists,(string *)&ccConfig);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)ccConfig._M_dataplus._M_p != paVar1) {
      operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
    }
    lVar17 = std::__cxx11::string::find((char)&cmdLists,0x24);
    if (lVar17 == -1) {
      ccConfig._M_string_length = 0;
      ccConfig.field_2._M_allocated_capacity =
           ccConfig.field_2._M_allocated_capacity & 0xffffffffffffff00;
      ccConfig._M_dataplus._M_p = (pointer)paVar1;
      bVar11 = cmTarget::IsPerConfig(this_05->Target);
      if ((bVar11) && (TVar13 = cmGeneratorTarget::GetType(this_05), TVar13 != GLOBAL_TARGET)) {
        std::__cxx11::string::_M_assign((string *)&ccConfig);
      }
      __n = config->_M_string_length;
      if ((__n == fileConfig->_M_string_length) &&
         ((__n == 0 ||
          (iVar14 = bcmp((config->_M_dataplus)._M_p,(fileConfig->_M_dataplus)._M_p,__n), iVar14 == 0
          )))) {
LAB_0041a644:
        cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                  (&local_338,&this->super_cmNinjaTargetGenerator);
        plVar23 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x7935f4);
        psVar26 = (size_type *)(plVar23 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar23 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar26) {
          local_558.field_2._M_allocated_capacity = *psVar26;
          local_558.field_2._8_4_ = (undefined4)plVar23[3];
          local_558.field_2._12_4_ = *(undefined4 *)((long)plVar23 + 0x1c);
          local_558._M_dataplus._M_p = (pointer)paVar4;
        }
        else {
          local_558.field_2._M_allocated_capacity = *psVar26;
          local_558._M_dataplus._M_p = (pointer)*plVar23;
        }
        local_558._M_string_length = plVar23[1];
        *plVar23 = (long)psVar26;
        plVar23[1] = 0;
        *(undefined1 *)(plVar23 + 2) = 0;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"");
        local_68.GG = util_outputs.GG;
        local_68.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_68.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             util_outputs.ExplicitOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        util_outputs.ExplicitOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_68.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_68.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_68.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             util_outputs.WorkDirOuts.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        util_outputs.WorkDirOuts.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_300.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_300.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_300.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             deps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        deps.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_318.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        cmGlobalNinjaGenerator::WriteCustomCommandBuild
                  (this_02,(string *)&cmdLists,&desc,&local_558,&local_450,&local_470,uses_terminal,
                   true,&ccConfig,&local_68,&local_300,&local_318);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_318);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_300);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68.WorkDirOuts);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_68.ExplicitOuts);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558._M_dataplus._M_p != paVar4) {
          operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        psVar15 = cmGeneratorTarget::GetName_abi_cxx11_(this_05);
        cVar22 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(&(this_02->PerConfigUtilityTargets)._M_t,psVar15);
        if ((_Rb_tree_header *)cVar22._M_node !=
            &(this_02->PerConfigUtilityTargets)._M_t._M_impl.super__Rb_tree_header)
        goto LAB_0041a644;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&phonyBuild.ExplicitDeps,&utilCommandName);
      TVar13 = cmGeneratorTarget::GetType(this_05);
      if (TVar13 == GLOBAL_TARGET) {
        pcVar24 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
      }
      else {
        pcVar24 = cmNinjaTargetGenerator::GetImplFileStream
                            (&this->super_cmNinjaTargetGenerator,fileConfig);
      }
      cmGlobalNinjaGenerator::WriteBuild(this_02,(ostream *)pcVar24,&phonyBuild,0,(bool *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)ccConfig._M_dataplus._M_p != paVar1) {
        operator_delete(ccConfig._M_dataplus._M_p,ccConfig.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)desc._M_dataplus._M_p != &desc.field_2) {
        operator_delete(desc._M_dataplus._M_p,
                        CONCAT71(desc.field_2._M_allocated_capacity._1_7_,
                                 desc.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)cmdLists._M_elems[0] != &local_588) {
        operator_delete(cmdLists._M_elems[0],(ulong)(local_588._M_allocated_capacity + 1));
      }
      goto LAB_0041a954;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)desc._M_dataplus._M_p != paVar2) {
      operator_delete(desc._M_dataplus._M_p,
                      CONCAT71(desc.field_2._M_allocated_capacity._1_7_,desc.field_2._M_local_buf[0]
                              ) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cmdLists._M_elems[0] == &local_588) goto LAB_0041a9b3;
  }
  operator_delete(cmdLists._M_elems[0],(ulong)(local_588._M_allocated_capacity + 1));
LAB_0041a9b3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outputConfig._M_dataplus._M_p != &outputConfig.field_2) {
    operator_delete(outputConfig._M_dataplus._M_p,outputConfig.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs.WorkDirOuts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&util_outputs.ExplicitOuts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&deps);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  cmNinjaBuild::~cmNinjaBuild(&phonyBuild);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)utilCommandName._M_dataplus._M_p != &utilCommandName.field_2) {
    operator_delete(utilCommandName._M_dataplus._M_p,
                    utilCommandName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)configDir._M_dataplus._M_p != &configDir.field_2) {
    operator_delete(configDir._M_dataplus._M_p,
                    CONCAT71(configDir.field_2._M_allocated_capacity._1_7_,
                             configDir.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements(
  std::string const& config, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
  cmLocalNinjaGenerator* lg = this->GetLocalGenerator();
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  std::string configDir;
  if (genTarget->Target->IsPerConfig()) {
    configDir = gg->ConfigDirectory(fileConfig);
  }
  std::string utilCommandName =
    cmStrCat(lg->GetCurrentBinaryDirectory(), "/CMakeFiles", configDir, "/",
             this->GetTargetName(), ".util");
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  cmNinjaBuild phonyBuild("phony");
  std::vector<std::string> commands;
  cmNinjaDeps deps;
  cmGlobalNinjaGenerator::CCOutputs util_outputs(gg);
  util_outputs.ExplicitOuts.emplace_back(utilCommandName);

  bool uses_terminal = false;
  {
    std::array<std::vector<cmCustomCommand> const*, 2> const cmdLists = {
      { &genTarget->GetPreBuildCommands(), &genTarget->GetPostBuildCommands() }
    };

    for (std::vector<cmCustomCommand> const* cmdList : cmdLists) {
      for (cmCustomCommand const& ci : *cmdList) {
        cmCustomCommandGenerator ccg(ci, fileConfig, lg);
        lg->AppendCustomCommandDeps(ccg, deps, fileConfig);
        lg->AppendCustomCommandLines(ccg, commands);
        util_outputs.Add(ccg.GetByproducts());
        if (ci.GetUsesTerminal()) {
          uses_terminal = true;
        }
      }
    }
  }

  {
    std::vector<cmSourceFile*> sources;
    genTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* source : sources) {
      if (cmCustomCommand const* cc = source->GetCustomCommand()) {
        cmCustomCommandGenerator ccg(*cc, config, lg);
        lg->AddCustomCommandTarget(cc, genTarget);

        // Depend on all custom command outputs.
        const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
        const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
        std::transform(ccOutputs.begin(), ccOutputs.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
      }
    }
  }

  std::string outputConfig;
  if (genTarget->Target->IsPerConfig()) {
    outputConfig = config;
  }
  lg->AppendTargetOutputs(genTarget, phonyBuild.Outputs, outputConfig);
  if (genTarget->Target->GetType() != cmStateEnums::GLOBAL_TARGET) {
    lg->AppendTargetOutputs(genTarget, gg->GetByproductsForCleanTarget(),
                            config);
    std::copy(util_outputs.ExplicitOuts.begin(),
              util_outputs.ExplicitOuts.end(),
              std::back_inserter(gg->GetByproductsForCleanTarget()));
  }
  lg->AppendTargetDepends(genTarget, deps, config, fileConfig,
                          DependOnTargetArtifact);

  if (commands.empty()) {
    phonyBuild.Comment = "Utility command for " + this->GetTargetName();
    phonyBuild.ExplicitDeps = std::move(deps);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  } else {
    std::string command = lg->BuildCommandLine(
      commands, config, fileConfig, "utility", this->GeneratorTarget);
    std::string desc;
    cmValue echoStr = genTarget->GetProperty("EchoString");
    if (echoStr) {
      desc = *echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");
    command = gg->ExpandCFGIntDir(command, config);

    if (command.find('$') != std::string::npos) {
      return;
    }

    std::string ccConfig;
    if (genTarget->Target->IsPerConfig() &&
        genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      ccConfig = config;
    }
    if (config == fileConfig ||
        gg->GetPerConfigUtilityTargets().count(genTarget->GetName())) {
      gg->WriteCustomCommandBuild(
        command, desc, "Utility command for " + this->GetTargetName(),
        /*depfile*/ "", /*job_pool*/ "", uses_terminal,
        /*restat*/ true, ccConfig, std::move(util_outputs), std::move(deps));
    }

    phonyBuild.ExplicitDeps.push_back(utilCommandName);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  }

  // Find ADDITIONAL_CLEAN_FILES
  this->AdditionalCleanFiles(config);

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
    gg->AddTargetAlias(this->GetTargetName(), genTarget, config);
  }
}